

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.h
# Opt level: O0

uint8_t * icu_63::BytesTrie::skipDelta(uint8_t *pos)

{
  uint uVar1;
  uint8_t *puStack_10;
  int32_t delta;
  uint8_t *pos_local;
  
  puStack_10 = pos + 1;
  uVar1 = (uint)*pos;
  if (0xbf < uVar1) {
    if (uVar1 < 0xf0) {
      puStack_10 = pos + 2;
    }
    else if (uVar1 < 0xfe) {
      puStack_10 = pos + 3;
    }
    else {
      puStack_10 = puStack_10 + (int)((uVar1 & 1) + 3);
    }
  }
  return puStack_10;
}

Assistant:

static inline const uint8_t *skipDelta(const uint8_t *pos) {
        int32_t delta=*pos++;
        if(delta>=kMinTwoByteDeltaLead) {
            if(delta<kMinThreeByteDeltaLead) {
                ++pos;
            } else if(delta<kFourByteDeltaLead) {
                pos+=2;
            } else {
                pos+=3+(delta&1);
            }
        }
        return pos;
    }